

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

ATTRIBUTE_ID * getAttributeId(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  KEY pXVar1;
  STRING_POOL *pool;
  XML_Char XVar2;
  DTD *pDVar3;
  XML_Bool XVar4;
  XML_Char *pXVar5;
  ATTRIBUTE_ID *pAVar6;
  XML_Char *pXVar7;
  PREFIX *pPVar8;
  char cVar9;
  long lVar10;
  long lVar11;
  
  pDVar3 = parser->m_dtd;
  pool = &pDVar3->pool;
  pXVar5 = (pDVar3->pool).ptr;
  if (pXVar5 == (pDVar3->pool).end) {
    XVar4 = poolGrow(pool);
    if (XVar4 == '\0') {
      return (ATTRIBUTE_ID *)0x0;
    }
    pXVar5 = (pDVar3->pool).ptr;
  }
  (pDVar3->pool).ptr = pXVar5 + 1;
  *pXVar5 = '\0';
  pXVar5 = poolStoreString(pool,enc,start,end);
  if (pXVar5 != (XML_Char *)0x0) {
    pXVar1 = pXVar5 + 1;
    pAVar6 = (ATTRIBUTE_ID *)lookup(parser,&pDVar3->attributeIds,pXVar1,0x18);
    if (pAVar6 != (ATTRIBUTE_ID *)0x0) {
      if (pAVar6->name != pXVar1) {
        (pDVar3->pool).ptr = (pDVar3->pool).start;
        return pAVar6;
      }
      pXVar7 = (pDVar3->pool).ptr;
      (pDVar3->pool).start = pXVar7;
      if (parser->m_ns == '\0') {
        return pAVar6;
      }
      cVar9 = *pXVar1;
      if ((((cVar9 == 'x') && (pXVar5[2] == 'm')) && (pXVar5[3] == 'l')) &&
         ((pXVar5[4] == 'n' && (pXVar5[5] == 's')))) {
        if (pXVar5[6] == ':') {
          pPVar8 = (PREFIX *)lookup(parser,&pDVar3->prefixes,pXVar5 + 7,0x10);
LAB_0016e254:
          pAVar6->prefix = pPVar8;
          pAVar6->xmlns = '\x01';
          return pAVar6;
        }
        if (pXVar5[6] == '\0') {
          pPVar8 = &pDVar3->defaultPrefix;
          goto LAB_0016e254;
        }
      }
      lVar11 = 0;
      while( true ) {
        if (cVar9 == '\0') {
          return pAVar6;
        }
        if (cVar9 == ':') break;
        cVar9 = pXVar5[lVar11 + 2];
        lVar11 = lVar11 + 1;
      }
      if (lVar11 != 0) {
        lVar10 = 0;
        do {
          pXVar5 = (pDVar3->pool).ptr;
          if (pXVar5 == (pDVar3->pool).end) {
            XVar4 = poolGrow(pool);
            if (XVar4 == '\0') {
              return (ATTRIBUTE_ID *)0x0;
            }
            pXVar5 = (pDVar3->pool).ptr;
          }
          XVar2 = pXVar1[lVar10];
          (pDVar3->pool).ptr = pXVar5 + 1;
          *pXVar5 = XVar2;
          lVar10 = lVar10 + 1;
        } while (lVar11 != lVar10);
        pXVar7 = (pDVar3->pool).ptr;
      }
      if (pXVar7 == (pDVar3->pool).end) {
        XVar4 = poolGrow(pool);
        if (XVar4 == '\0') {
          return (ATTRIBUTE_ID *)0x0;
        }
        pXVar7 = (pDVar3->pool).ptr;
      }
      (pDVar3->pool).ptr = pXVar7 + 1;
      *pXVar7 = '\0';
      pPVar8 = (PREFIX *)lookup(parser,&pDVar3->prefixes,(pDVar3->pool).start,0x10);
      pAVar6->prefix = pPVar8;
      if (pPVar8 != (PREFIX *)0x0) {
        pXVar1 = (pDVar3->pool).start;
        if (pPVar8->name == pXVar1) {
          (pDVar3->pool).start = (pDVar3->pool).ptr;
          return pAVar6;
        }
        (pDVar3->pool).ptr = pXVar1;
        return pAVar6;
      }
    }
  }
  return (ATTRIBUTE_ID *)0x0;
}

Assistant:

static ATTRIBUTE_ID *
getAttributeId(XML_Parser parser, const ENCODING *enc, const char *start,
               const char *end) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  ATTRIBUTE_ID *id;
  const XML_Char *name;
  if (! poolAppendChar(&dtd->pool, XML_T('\0')))
    return NULL;
  name = poolStoreString(&dtd->pool, enc, start, end);
  if (! name)
    return NULL;
  /* skip quotation mark - its storage will be reused (like in name[-1]) */
  ++name;
  id = (ATTRIBUTE_ID *)lookup(parser, &dtd->attributeIds, name,
                              sizeof(ATTRIBUTE_ID));
  if (! id)
    return NULL;
  if (id->name != name)
    poolDiscard(&dtd->pool);
  else {
    poolFinish(&dtd->pool);
    if (! parser->m_ns)
      ;
    else if (name[0] == XML_T(ASCII_x) && name[1] == XML_T(ASCII_m)
             && name[2] == XML_T(ASCII_l) && name[3] == XML_T(ASCII_n)
             && name[4] == XML_T(ASCII_s)
             && (name[5] == XML_T('\0') || name[5] == XML_T(ASCII_COLON))) {
      if (name[5] == XML_T('\0'))
        id->prefix = &dtd->defaultPrefix;
      else
        id->prefix = (PREFIX *)lookup(parser, &dtd->prefixes, name + 6,
                                      sizeof(PREFIX));
      id->xmlns = XML_TRUE;
    } else {
      int i;
      for (i = 0; name[i]; i++) {
        /* attributes without prefix are *not* in the default namespace */
        if (name[i] == XML_T(ASCII_COLON)) {
          int j;
          for (j = 0; j < i; j++) {
            if (! poolAppendChar(&dtd->pool, name[j]))
              return NULL;
          }
          if (! poolAppendChar(&dtd->pool, XML_T('\0')))
            return NULL;
          id->prefix = (PREFIX *)lookup(parser, &dtd->prefixes,
                                        poolStart(&dtd->pool), sizeof(PREFIX));
          if (! id->prefix)
            return NULL;
          if (id->prefix->name == poolStart(&dtd->pool))
            poolFinish(&dtd->pool);
          else
            poolDiscard(&dtd->pool);
          break;
        }
      }
    }
  }
  return id;
}